

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegd_parser.c
# Opt level: O0

MPP_RET jpegd_deinit(void *ctx)

{
  JpegdCtx *JpegCtx;
  void *ctx_local;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_deinit");
  }
  if (*(long *)((long)ctx + 0x18) != 0) {
    mpp_osal_free("jpegd_deinit",*(void **)((long)ctx + 0x18));
    *(undefined8 *)((long)ctx + 0x18) = 0;
  }
  if (*(long *)((long)ctx + 0x30) != 0) {
    mpp_frame_deinit((MppFrame *)((long)ctx + 0x30));
  }
  if (*(int *)((long)ctx + 0x48) == 0) {
    *(undefined8 *)((long)ctx + 0x28) = 0;
  }
  else if (*(long *)((long)ctx + 0x28) != 0) {
    mpp_packet_deinit((MppPacket *)((long)ctx + 0x28));
  }
  if (*(long *)((long)ctx + 0x60) != 0) {
    mpp_osal_free("jpegd_deinit",*(void **)((long)ctx + 0x60));
    *(undefined8 *)((long)ctx + 0x60) = 0;
  }
  if (*(long *)((long)ctx + 0x68) != 0) {
    mpp_osal_free("jpegd_deinit",*(void **)((long)ctx + 0x68));
    *(undefined8 *)((long)ctx + 0x68) = 0;
  }
  *(undefined8 *)((long)ctx + 0x38) = 0;
  *(undefined4 *)((long)ctx + 0x40) = 0;
  *(undefined4 *)((long)ctx + 0x44) = 0;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_deinit");
  }
  return MPP_OK;
}

Assistant:

static MPP_RET jpegd_deinit(void *ctx)
{
    jpegd_dbg_func("enter\n");
    JpegdCtx *JpegCtx = (JpegdCtx *)ctx;

    if (JpegCtx->recv_buffer) {
        mpp_free(JpegCtx->recv_buffer);
        JpegCtx->recv_buffer = NULL;
    }

    if (JpegCtx->output_frame) {
        mpp_frame_deinit(&JpegCtx->output_frame);
    }

    if (JpegCtx->copy_flag) {
        if (JpegCtx->input_packet) {
            mpp_packet_deinit(&JpegCtx->input_packet);
        }
    } else {
        JpegCtx->input_packet = NULL;
    }

    if (JpegCtx->bit_ctx) {
        mpp_free(JpegCtx->bit_ctx);
        JpegCtx->bit_ctx = NULL;
    }

    if (JpegCtx->syntax) {
        mpp_free(JpegCtx->syntax);
        JpegCtx->syntax = NULL;
    }

    JpegCtx->pts = 0;
    JpegCtx->eos = 0;
    JpegCtx->input_jpeg_count = 0;

    jpegd_dbg_func("exit\n");
    return 0;
}